

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurlHandle.cpp
# Opt level: O1

int __thiscall
curlpp::internal::CurlHandle::executeDebugFunctor
          (CurlHandle *this,curl_infotype info,char *buffer,size_t size)

{
  FunctorImpl<int,_utilspp::tl::TypeList<curl_infotype,_utilspp::tl::TypeList<char_*,_utilspp::tl::TypeList<unsigned_long,_utilspp::NullType>_>_>_>
  *pFVar1;
  int iVar2;
  CallbackExceptionBase *this_00;
  undefined4 in_register_00000034;
  LogicError local_20;
  
  pFVar1 = (this->mDebugFunctor).mImpl._M_ptr;
  if (pFVar1 == (FunctorImpl<int,_utilspp::tl::TypeList<curl_infotype,_utilspp::tl::TypeList<char_*,_utilspp::tl::TypeList<unsigned_long,_utilspp::NullType>_>_>_>
                 *)0x0) {
    this_00 = (CallbackExceptionBase *)operator_new(0x20);
    LogicError::LogicError(&local_20,"Null write functor");
    CallbackExceptionBase::CallbackExceptionBase(this_00);
    *(undefined ***)&this_00->super_RuntimeError = &PTR__CallbackException_00133c90;
    std::logic_error::logic_error((logic_error *)(this_00 + 1),&local_20.super_logic_error);
    *(undefined ***)&this_00[1].super_RuntimeError = &PTR__LogicError_00133948;
    if (this->mException != (CallbackExceptionBase *)0x0) {
      (**(code **)(*(long *)&this->mException->super_RuntimeError + 8))();
    }
    this->mException = this_00;
    LogicError::~LogicError(&local_20);
    iVar2 = 0x2a;
  }
  else {
    iVar2 = (*(code *)**(undefined8 **)pFVar1)(pFVar1,CONCAT44(in_register_00000034,info));
  }
  return iVar2;
}

Assistant:

int 
CurlHandle::executeDebugFunctor(curl_infotype info, char * buffer, size_t size)
{
	if (!mDebugFunctor)
	{
		setException(new CallbackException<curlpp::LogicError>(curlpp::LogicError("Null write functor")));
		return CURLE_ABORTED_BY_CALLBACK;
	}

	try
	{
		return mDebugFunctor(info, buffer, size);
	}

	catch(curlpp::CallbackExceptionBase * e)
	{
		setException(e);
	}

	catch(...)
	{
		setException(new CallbackException<curlpp::UnknowException>(curlpp::UnknowException()));
	}

	return CURLE_ABORTED_BY_CALLBACK;
}